

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int main(int argc,char **argv)

{
  int in_EDI;
  ztresult_t rc;
  char *in_stack_00000060;
  char *in_stack_00000068;
  uint local_14;
  
  local_14 = 0;
  ztlex_selftest();
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  ztlex_stringtest((char *)argv);
  if (1 < in_EDI) {
    local_14 = parse_and_dump_dot(in_stack_00000068,in_stack_00000060);
    if (local_14 == 0) {
      printf("ztast.dot created\n");
    }
    else {
      fprintf(_stderr,"parse_and_dump_dot() returned error %x\n",(ulong)local_14);
    }
  }
  return (uint)(local_14 != 0);
}

Assistant:

int main(int argc, char *argv[])
{
  ztresult_t rc = ztresult_OK;

  (void) Fortify_EnterScope();

  ztlex_selftest();

  ztlex_stringtest("");
  ztlex_stringtest(" ");
  ztlex_stringtest("x = 0;");
  ztlex_stringtest("y = [ 1 ];");
  ztlex_stringtest("()*+,-/;=[]{}"); /* no colon */
  ztlex_stringtest("1.23");
  ztlex_stringtest("$FF");
  ztlex_stringtest("0xFF");
  ztlex_stringtest("255");
  ztlex_stringtest("potato");
  ztlex_stringtest("nil");
  ztlex_stringtest("1nil2");
  ztlex_stringtest(" 1 nil 2 ");

  if (argc > 1)
  {
    rc = parse_and_dump_dot(argv[1], "ztast.dot");
    if (rc != ztresult_OK)
      fprintf(stderr, "parse_and_dump_dot() returned error %x\n", rc);
    else
      printf("ztast.dot created\n");
  }

  (void) Fortify_LeaveScope();

#ifdef FORTIFY
  printf("Fortify is enabled\n");
  Fortify_DumpAllMemory();
#endif

  return (rc == ztresult_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
}